

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockDXT.cpp
# Opt level: O1

void __thiscall nv::AlphaBlockDXT5::evaluatePalette8(AlphaBlockDXT5 *this,uint8 *alpha)

{
  uint64 uVar1;
  uint64 uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (this->field_0).u;
  *alpha = (uint8)uVar1;
  uVar2 = (this->field_0).u;
  alpha[1] = (uint8)(uVar2 >> 8);
  uVar3 = (uint)uVar1 & 0xff;
  uVar4 = (uint)(uVar2 >> 8) & 0xff;
  alpha[2] = (uint8)((uVar3 * 6 + uVar4) / 7);
  alpha[3] = (uint8)((uVar3 * 5 + uVar4 * 2) * 0x2493 >> 0x10);
  alpha[4] = (uint8)((uVar4 * 3 + uVar3 * 4) * 0x2493 >> 0x10);
  alpha[5] = (uint8)((uVar3 * 3 + uVar4 * 4) * 0x2493 >> 0x10);
  alpha[6] = (uint8)((uVar4 * 5 + uVar3 * 2) * 0x2493 >> 0x10);
  alpha[7] = (uint8)((uVar4 * 6 + uVar3) / 7);
  return;
}

Assistant:

void AlphaBlockDXT5::evaluatePalette8(uint8 alpha[8]) const
{
	// 8-alpha block:  derive the other six alphas.
	// Bit code 000 = alpha0, 001 = alpha1, others are interpolated.
	alpha[0] = alpha0;
	alpha[1] = alpha1;
	alpha[2] = (6 * alpha[0] + 1 * alpha[1]) / 7;	// bit code 010
	alpha[3] = (5 * alpha[0] + 2 * alpha[1]) / 7;	// bit code 011
	alpha[4] = (4 * alpha[0] + 3 * alpha[1]) / 7;	// bit code 100
	alpha[5] = (3 * alpha[0] + 4 * alpha[1]) / 7;	// bit code 101
	alpha[6] = (2 * alpha[0] + 5 * alpha[1]) / 7;	// bit code 110
	alpha[7] = (1 * alpha[0] + 6 * alpha[1]) / 7;	// bit code 111
}